

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.c
# Opt level: O3

int func_getargs(void)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  ushort **ppuVar7;
  long lVar8;
  char *pcVar9;
  byte *pbVar10;
  uint uVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  int iVar15;
  byte bVar16;
  char (*pacVar17) [80];
  long lVar18;
  char *pcVar19;
  undefined1 auVar20 [16];
  ulong local_58;
  
  lVar18 = (long)func_idx;
  if (lVar18 == 7) {
    pcVar14 = "Too many nested function calls!";
  }
  else {
    ppuVar7 = __ctype_b_loc();
    auVar4 = _DAT_001138b0;
    bVar16 = *(byte *)((long)*ppuVar7 + (ulong)*expr * 2 + 1);
    pbVar10 = expr;
    while ((bVar16 & 0x20) != 0) {
      pbVar10 = pbVar10 + 1;
      bVar16 = *(byte *)((long)*ppuVar7 + (ulong)*pbVar10 * 2 + 1);
    }
    expr = pbVar10 + 1;
    if (*pbVar10 != 0x28) {
      return 0;
    }
    pacVar17 = func_arg[lVar18];
    lVar8 = 0x50;
    auVar20 = _DAT_001138a0;
    do {
      if (SUB164(auVar20 ^ auVar4,4) == -0x80000000 && SUB164(auVar20 ^ auVar4,0) < -0x7ffffff7) {
        func_line[lVar8 + lVar18 * 800 + 0x40] = '\0';
        (*(char (*) [80])*pacVar17)[lVar8] = '\0';
      }
      iVar5 = func_idx;
      lVar12 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 2;
      auVar20._8_8_ = lVar12 + 2;
      lVar8 = lVar8 + 0xa0;
    } while (lVar8 != 0x370);
    lVar18 = (long)func_idx;
    pcVar14 = (char *)0x0;
    local_58 = 0;
LAB_0010c8fd:
    do {
      bVar16 = *(byte *)((long)*ppuVar7 + (ulong)*expr * 2 + 1);
      pcVar9 = (char *)expr;
      while ((bVar16 & 0x20) != 0) {
        pcVar9 = pcVar9 + 1;
        bVar16 = *(byte *)((long)*ppuVar7 + (ulong)(byte)*pcVar9 * 2 + 1);
      }
      expr = (uchar *)(pcVar9 + 1);
      bVar16 = *pcVar9;
      if (bVar16 < 0x2c) {
        if (bVar16 != 0) {
          if (bVar16 == 0x29) {
            return 1;
          }
LAB_0010c95a:
          uVar6 = 0;
          bVar2 = false;
          iVar15 = 0;
          lVar8 = 0;
          bVar3 = false;
          pcVar19 = (char *)expr;
          pcVar9 = (char *)expr;
LAB_0010c970:
          while (pcVar13 = pcVar9 + 1, bVar16 == 0) {
            if (!bVar3) goto LAB_0010cab0;
            bVar3 = false;
            bVar16 = *pcVar9;
            pcVar19 = pcVar19 + 1;
            pcVar9 = pcVar13;
            expr = (uchar *)pcVar13;
          }
          if (bVar16 < 0x2c) {
            if (bVar16 == 0x28) {
              iVar15 = iVar15 + 1;
            }
            else if (bVar16 == 0x29) {
              if (iVar15 == 0) goto LAB_0010cab0;
              iVar15 = iVar15 + -1;
            }
          }
          else if (bVar16 == 0x2c) {
            if (iVar15 == 0) goto LAB_0010cab0;
          }
          else {
            if (bVar16 == 0x3b) goto LAB_0010cab0;
            if (bVar16 == 0x5c) {
              if (iVar5 == 0) {
                pcVar14 = "Syntax error!";
                goto LAB_0010c7e3;
              }
              bVar1 = *pcVar9;
              if ((byte)(bVar1 - 0x3a) < 0xf7) {
                pcVar14 = "Invalid function argument index!";
                expr = (uchar *)pcVar13;
                goto LAB_0010c7e3;
              }
              bVar16 = func_arg[lVar18 + -1][bVar1 - 0x31][0];
              bVar3 = true;
              pcVar19 = pcVar13;
              pcVar9 = pcVar13;
              expr = (uchar *)pcVar13;
              pcVar14 = func_arg[lVar18 + -1][bVar1 - 0x31] + 1;
              goto LAB_0010c970;
            }
          }
          if (bVar2) {
            bVar2 = true;
            if (bVar16 != 0x20) {
              lVar12 = (long)(int)uVar6;
              if (lVar12 < lVar8) {
                uVar11 = ~uVar6;
                uVar6 = (uint)lVar8;
                memset(*(char (*) [80])*pacVar17 + lVar12,0x20,(ulong)(uVar11 + uVar6) + 1);
                lVar12 = (long)(int)uVar6;
              }
LAB_0010ca7a:
              uVar6 = uVar6 + 1;
              (*(char (*) [80])*pacVar17)[lVar12] = bVar16;
              bVar2 = false;
            }
          }
          else {
            bVar2 = true;
            if (bVar16 != 0x20) {
              lVar12 = (long)(int)uVar6;
              goto LAB_0010ca7a;
            }
          }
          if (uVar6 == 0x50) {
            pcVar14 = "Invalid function argument length!";
            goto LAB_0010c7e3;
          }
          if (bVar3) {
            pcVar9 = pcVar19;
            pcVar13 = pcVar14 + 1;
            pcVar19 = pcVar14;
          }
          else {
            pcVar9 = pcVar19 + 1;
            pcVar13 = pcVar14;
            expr = (uchar *)pcVar9;
          }
          lVar8 = lVar8 + 1;
          bVar16 = *pcVar19;
          pcVar19 = pcVar9;
          pcVar14 = pcVar13;
          goto LAB_0010c970;
        }
LAB_0010cb05:
        pcVar14 = "Syntax error in function call!";
        goto LAB_0010c7e3;
      }
      if (bVar16 != 0x2c) {
        if (bVar16 != 0x3b) goto LAB_0010c95a;
        goto LAB_0010cb05;
      }
      uVar6 = (int)local_58 + 1;
      local_58 = (ulong)uVar6;
      pacVar17 = func_arg[lVar18] + local_58;
    } while (uVar6 != 9);
    pcVar14 = "Too many arguments for a function!";
  }
LAB_0010c7e3:
  error(pcVar14);
  return 0;
LAB_0010cab0:
  (*(char (*) [80])*pacVar17)[(int)uVar6] = '\0';
  expr = expr + -1;
  goto LAB_0010c8fd;
}

Assistant:

int
func_getargs(void)
{
	char c, *ptr, *line;
	int arg, level, space, flag;
	int i, x;

	/* can not nest too much macros */
	if (func_idx == 7) {
		error("Too many nested function calls!");
		return (0);
	}

	/* skip spaces */
	while (isspace(*expr))
		expr++;

	/* function args must be enclosed in parenthesis */
	if (*expr++ != '(')
		return (0);

	/* initialize args */
    line = NULL;
	ptr  = func_arg[func_idx][0];
	arg  = 0;

	for (i = 0; i < 9; i++)
		func_arg[func_idx][i][0] = '\0';

	/* get args one by one */
	for (;;) {
		/* skip spaces */
		while (isspace(*expr))
			expr++;

		c = *expr++;
		switch (c) {
		/* empty arg */
		case ',':
			arg++;
			ptr = func_arg[func_idx][arg];
			if (arg == 9) {
				error("Too many arguments for a function!");
				return (0);
			}
			break;

		/* end of line */	
		case ';':
		case '\0':
			error("Syntax error in function call!");
			return (0);

		/* end of function */
		case ')':
			return (1);

		/* arg */
		default:
			space = 0;
			level = 0;
			flag = 0;
			i = 0;
			x = 0;
			for (;;) {
				if (c == '\0') {
					if (flag == 0)
						break;
					else {
						flag = 0;
						c = *expr++;
						continue;
					}
				}
				else if (c == ';') {
					break;
				}
				else if (c == ',') {
					if (level == 0)
						break;
				}
				else if (c == '\\') {
					if (func_idx == 0) {
						error("Syntax error!");
						return (0);
					}
					c = *expr++;
					if (c < '1' || c > '9') {
						error("Invalid function argument index!");
						return (0);
					}
					line = func_arg[func_idx - 1][c - '1'];
					flag = 1;
					c = *line++;
					continue;
				}
				else if (c == '(') {
					level++;
				}
				else if (c == ')') {
					if (level == 0)
						break;
					level--;
				}
				if (space) {
					if (c != ' ') {
						while (i < x)
							ptr[i++] = ' ';
						ptr[i++] = c;
						space = 0;
					}
				}
				else if (c == ' ') {
					space = 1;
				}
				else {
					ptr[i++] = c;
				}
				if (i == 80) {
					error("Invalid function argument length!");
					return (0);
				}
				x++;
				if (flag)
					c = *line++;
				else
					c = *expr++;
			}
			ptr[i] = '\0';
			expr--;
			break;
		}
	}
}